

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Cluster::CreateBlock
          (Cluster *this,longlong id,longlong pos,longlong size,longlong discard_padding)

{
  long lVar1;
  BlockEntry **ppBVar2;
  BlockEntry **ppBVar3;
  long lVar4;
  long lVar5;
  
  if ((id != 0xa3) && (id != 0xa0)) {
    return -1;
  }
  lVar5 = this->m_entries_count;
  if (lVar5 < 0) {
    this->m_entries_size = 0x400;
    ppBVar3 = (BlockEntry **)operator_new__(0x2000,(nothrow_t *)&std::nothrow);
    this->m_entries = ppBVar3;
    if (ppBVar3 == (BlockEntry **)0x0) {
      return -1;
    }
    this->m_entries_count = 0;
  }
  else {
    lVar1 = this->m_entries_size;
    if (lVar1 <= lVar5) {
      ppBVar3 = (BlockEntry **)
                operator_new__(-(ulong)((ulong)(lVar1 * 2) >> 0x3d != 0) | lVar1 << 4,
                               (nothrow_t *)&std::nothrow);
      if (ppBVar3 == (BlockEntry **)0x0) {
        return -1;
      }
      ppBVar2 = this->m_entries;
      if (lVar5 != 0) {
        lVar4 = 0;
        do {
          *(undefined8 *)((long)ppBVar3 + lVar4) = *(undefined8 *)((long)ppBVar2 + lVar4);
          lVar4 = lVar4 + 8;
        } while (lVar5 << 3 != lVar4);
      }
      if (ppBVar2 != (BlockEntry **)0x0) {
        operator_delete__(ppBVar2);
      }
      this->m_entries = ppBVar3;
      this->m_entries_size = lVar1 * 2;
    }
  }
  if (id != 0xa0) {
    lVar5 = CreateSimpleBlock(this,pos,size);
    return lVar5;
  }
  lVar5 = CreateBlockGroup(this,pos,size,discard_padding);
  return lVar5;
}

Assistant:

long Cluster::CreateBlock(long long id,
                          long long pos,  // absolute pos of payload
                          long long size, long long discard_padding) {
  if (id != libwebm::kMkvBlockGroup && id != libwebm::kMkvSimpleBlock)
    return E_PARSE_FAILED;

  if (m_entries_count < 0) {  // haven't parsed anything yet
    assert(m_entries == NULL);
    assert(m_entries_size == 0);

    m_entries_size = 1024;
    m_entries = new (std::nothrow) BlockEntry*[m_entries_size];
    if (m_entries == NULL)
      return -1;

    m_entries_count = 0;
  } else {
    assert(m_entries);
    assert(m_entries_size > 0);
    assert(m_entries_count <= m_entries_size);

    if (m_entries_count >= m_entries_size) {
      const long entries_size = 2 * m_entries_size;

      BlockEntry** const entries = new (std::nothrow) BlockEntry*[entries_size];
      if (entries == NULL)
        return -1;

      BlockEntry** src = m_entries;
      BlockEntry** const src_end = src + m_entries_count;

      BlockEntry** dst = entries;

      while (src != src_end)
        *dst++ = *src++;

      delete[] m_entries;

      m_entries = entries;
      m_entries_size = entries_size;
    }
  }

  if (id == libwebm::kMkvBlockGroup)
    return CreateBlockGroup(pos, size, discard_padding);
  else
    return CreateSimpleBlock(pos, size);
}